

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Liby::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
pop_wait(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
        BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  std::condition_variable::wait<Liby::BlockingQueue<std::__cxx11::string>::pop_wait()::_lambda()_1_>
            (&this->cond_,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this);
  pop_front_imp(__return_storage_ptr__,this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

T pop_wait() {
        std::unique_lock<std::mutex> lck(mutex_);
        cond_.wait(lck, [this] { return !queue_.empty(); });
        return pop_front_imp();
    }